

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::Jacobian
          (TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *this,TPZFMatrix<double> *coord,TPZVec<double> *par
          ,TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  TPZGeoEl *pTVar5;
  TPZGeoMesh *gmesh;
  bool bVar6;
  int iVar7;
  double *pdVar8;
  int64_t iVar9;
  int a_1;
  int side;
  ulong uVar10;
  int c;
  long row;
  int b_2;
  int b;
  long lVar11;
  int b_1;
  long lVar12;
  double dVar13;
  double local_b20;
  TPZGeoElSide neighbyside;
  REAL Det;
  TPZManVector<double,_3> NeighPar;
  TPZStack<int,_10> LowNodeSides;
  TPZManVector<double,_3> DblendTemp;
  TPZManVector<double,_3> Xside;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<double,_10> parChanged;
  TPZManVector<double,_10> SidesCounter;
  TPZManVector<double,_3> XNode;
  TPZManVector<double,_3> SidePar;
  TPZFNMatrix<9,_double> J1;
  TPZFNMatrix<9,_double> Jneighbourhood;
  TPZFNMatrix<9,_double> JacTemp;
  TPZFNMatrix<24,_double> blend;
  TPZFNMatrix<9,_double> Inv;
  TPZFNMatrix<9,_double> Ax;
  TPZFNMatrix<9,_double> J2;
  TPZFNMatrix<24,_double> Dblend;
  
  pTVar5 = this->fGeoEl;
  TPZManVector<double,_3>::TPZManVector(&NeighPar,0);
  TPZManVector<double,_3>::TPZManVector(&SidePar,0);
  blend.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&Xside,3,(double *)&blend);
  blend.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&XNode,3,(double *)&blend);
  blend.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&SidesCounter,0xf,(double *)&blend);
  TPZStack<int,_10>::TPZStack(&LowNodeSides);
  TPZStack<int,_10>::TPZStack(&LowAllSides);
  TPZFNMatrix<24,_double>::TPZFNMatrix(&blend,4,1);
  TPZFNMatrix<24,_double>::TPZFNMatrix(&Dblend,3,4);
  pztopology::TPZTetrahedron::TShape<double>
            (par,&blend.super_TPZFMatrix<double>,&Dblend.super_TPZFMatrix<double>);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&J1);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&J2);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&Ax);
  Jneighbourhood.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&JacTemp,3,3,(double *)&Jneighbourhood);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&Jneighbourhood);
  gmesh = pTVar5->fMesh;
  for (uVar10 = 0xe; side = (int)uVar10, 3 < uVar10; uVar10 = uVar10 - 1) {
    Neighbour(&neighbyside,this,side,gmesh);
    if ((neighbyside.fGeoEl != (TPZGeoEl *)0x0) && (-1 < neighbyside.fSide)) {
      pztopology::TPZTetrahedron::LowerDimensionSides(side,&LowNodeSides,0);
      pztopology::TPZTetrahedron::LowerDimensionSides(side,&LowAllSides);
      Neighbour((TPZGeoElSide *)&Inv,this,side,gmesh);
      iVar7 = TPZGeoElSide::Dimension((TPZGeoElSide *)&Inv);
      TPZFNMatrix<9,_double>::TPZFNMatrix(&Inv,(long)iVar7,(long)iVar7);
      iVar7 = TPZGeoElSide::Dimension(&neighbyside);
      bVar6 = MapToNeighSide<double>
                        (this,side,iVar7,par,&NeighPar.super_TPZVec<double>,
                         &Jneighbourhood.super_TPZFMatrix<double>);
      if (bVar6) {
        Neighbour((TPZGeoElSide *)&parChanged,this,side,gmesh);
        TPZGeoElSide::X((TPZGeoElSide *)&parChanged,&NeighPar.super_TPZVec<double>,
                        &Xside.super_TPZVec<double>);
        Neighbour((TPZGeoElSide *)&parChanged,this,side,gmesh);
        TPZGeoElSide::Jacobian
                  ((TPZGeoElSide *)&parChanged,&NeighPar.super_TPZVec<double>,
                   &J1.super_TPZFMatrix<double>,&Ax.super_TPZFMatrix<double>,&Det,
                   &Inv.super_TPZFMatrix<double>);
        TPZFMatrix<double>::Transpose(&Ax.super_TPZFMatrix<double>);
        TPZMatrix<double>::Multiply
                  ((TPZMatrix<double> *)&Ax,&J1.super_TPZFMatrix<double>,
                   &J2.super_TPZFMatrix<double>,0);
        TPZMatrix<double>::Multiply
                  ((TPZMatrix<double> *)&J2,&Jneighbourhood.super_TPZFMatrix<double>,
                   &J1.super_TPZFMatrix<double>,0);
        parChanged.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
        TPZManVector<double,_3>::TPZManVector(&DblendTemp,3,(double *)&parChanged);
        local_b20 = 0.0;
        for (lVar12 = 0;
            lVar12 < LowNodeSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
            lVar12 = lVar12 + 1) {
          TPZManVector<double,_10>::TPZManVector(&parChanged,par->fNElements);
          pztopology::TPZTetrahedron::TShape<double>
                    (&parChanged.super_TPZVec<double>,&blend.super_TPZFMatrix<double>,
                     &Dblend.super_TPZFMatrix<double>);
          pdVar8 = TPZFMatrix<double>::operator()
                             (&blend.super_TPZFMatrix<double>,
                              (long)LowNodeSides.super_TPZManVector<int,_10>.super_TPZVec<int>.
                                    fStore[lVar12],0);
          local_b20 = local_b20 + *pdVar8;
          for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
            pdVar8 = TPZFMatrix<double>::operator()
                               (&Dblend.super_TPZFMatrix<double>,lVar11,
                                (long)LowNodeSides.super_TPZManVector<int,_10>.super_TPZVec<int>.
                                      fStore[lVar12]);
            DblendTemp.super_TPZVec<double>.fStore[lVar11] =
                 *pdVar8 + DblendTemp.super_TPZVec<double>.fStore[lVar11];
          }
          TPZManVector<double,_10>::~TPZManVector(&parChanged);
        }
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
            dVar13 = SidesCounter.super_TPZVec<double>.fStore[uVar10];
            pdVar8 = TPZFMatrix<double>::operator()(&J1.super_TPZFMatrix<double>,lVar12,lVar11);
            dVar1 = *pdVar8;
            dVar2 = Xside.super_TPZVec<double>.fStore[lVar12];
            dVar3 = DblendTemp.super_TPZVec<double>.fStore[lVar11];
            pdVar8 = TPZFMatrix<double>::operator()(&JacTemp.super_TPZFMatrix<double>,lVar12,lVar11)
            ;
            *pdVar8 = (1.0 - dVar13) * (dVar1 * local_b20 + dVar2 * dVar3) + *pdVar8;
          }
        }
        iVar9 = LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
        if (LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements < 1) {
          iVar9 = 0;
        }
        for (lVar12 = 0; iVar9 != lVar12; lVar12 = lVar12 + 1) {
          SidesCounter.super_TPZVec<double>.fStore
          [LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[lVar12]] =
               (1.0 - SidesCounter.super_TPZVec<double>.fStore[uVar10]) +
               SidesCounter.super_TPZVec<double>.fStore
               [LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[lVar12]];
        }
        TPZManVector<double,_3>::~TPZManVector(&DblendTemp);
      }
      TPZFNMatrix<9,_double>::~TPZFNMatrix(&Inv);
    }
  }
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      for (row = 0; row != 3; row = row + 1) {
        dVar13 = SidesCounter.super_TPZVec<double>.fStore[lVar12];
        pdVar8 = TPZFMatrix<double>::operator()(coord,lVar11,lVar12);
        dVar1 = *pdVar8;
        pdVar8 = TPZFMatrix<double>::operator()(&Dblend.super_TPZFMatrix<double>,row,lVar12);
        dVar2 = *pdVar8;
        pdVar8 = TPZFMatrix<double>::operator()(&JacTemp.super_TPZFMatrix<double>,lVar11,row);
        *pdVar8 = (1.0 - dVar13) * dVar1 * dVar2 + *pdVar8;
      }
    }
  }
  TPZFMatrix<double>::operator=(jacobian,&JacTemp.super_TPZFMatrix<double>);
  (*(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (axes,3);
  (*(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (axes);
  (*(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacinv,(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
             (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  pdVar8 = TPZFMatrix<double>::operator()(axes,0,0);
  *pdVar8 = 1.0;
  pdVar8 = TPZFMatrix<double>::operator()(axes,1,1);
  *pdVar8 = 1.0;
  pdVar8 = TPZFMatrix<double>::operator()(axes,2,2);
  *pdVar8 = 1.0;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,2);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,1);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,0);
  *detjac = dVar1 * -dVar13 * *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,1);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,2);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,0);
  *detjac = dVar13 * dVar1 * *pdVar8 + *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,2);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,1);
  *detjac = dVar13 * dVar1 * *pdVar8 + *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,0);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,2);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,1);
  *detjac = *detjac - dVar1 * dVar13 * *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,1);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,2);
  *detjac = *detjac - dVar1 * dVar13 * *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,0);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,1);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,2);
  dVar13 = dVar13 * dVar1 * *pdVar8 + *detjac;
  uVar10 = -(ulong)(ABS(dVar13) < 1e-12);
  *detjac = (REAL)(uVar10 & 0x3d719799812dea11 | ~uVar10 & (ulong)dVar13);
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,2);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,1);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,1);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,2);
  dVar3 = *pdVar8;
  dVar4 = *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacinv,0,0);
  *pdVar8 = (-dVar13 * dVar1 + dVar2 * dVar3) / dVar4;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,2);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,1);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,1);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,2);
  dVar3 = *pdVar8;
  dVar4 = *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacinv,0,1);
  *pdVar8 = (dVar13 * dVar1 - dVar3 * dVar2) / dVar4;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,2);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,1);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,1);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,2);
  dVar3 = *pdVar8;
  dVar4 = *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacinv,0,2);
  *pdVar8 = (-dVar13 * dVar1 + dVar2 * dVar3) / dVar4;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,2);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,2);
  dVar3 = *pdVar8;
  dVar4 = *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacinv,1,0);
  *pdVar8 = (dVar13 * dVar1 - dVar3 * dVar2) / dVar4;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,2);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,2);
  dVar3 = *pdVar8;
  dVar4 = *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacinv,1,1);
  *pdVar8 = (-dVar13 * dVar1 + dVar2 * dVar3) / dVar4;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,2);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,2);
  dVar3 = *pdVar8;
  dVar4 = *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacinv,1,2);
  *pdVar8 = (dVar13 * dVar1 - dVar3 * dVar2) / dVar4;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,1);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,1);
  dVar3 = *pdVar8;
  dVar4 = *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacinv,2,0);
  *pdVar8 = (-dVar13 * dVar1 + dVar2 * dVar3) / dVar4;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,1);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,2,1);
  dVar3 = *pdVar8;
  dVar4 = *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacinv,2,1);
  *pdVar8 = (dVar13 * dVar1 - dVar3 * dVar2) / dVar4;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,1);
  dVar13 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,0,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(jacobian,1,1);
  dVar3 = *pdVar8;
  dVar4 = *detjac;
  pdVar8 = TPZFMatrix<double>::operator()(jacinv,2,2);
  *pdVar8 = (dVar2 * dVar3 - dVar13 * dVar1) / dVar4;
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&Jneighbourhood);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&JacTemp);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&Ax);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&J2);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&J1);
  TPZFNMatrix<24,_double>::~TPZFNMatrix(&Dblend);
  TPZFNMatrix<24,_double>::~TPZFNMatrix(&blend);
  TPZManVector<int,_10>::~TPZManVector(&LowAllSides.super_TPZManVector<int,_10>);
  TPZManVector<int,_10>::~TPZManVector(&LowNodeSides.super_TPZManVector<int,_10>);
  TPZManVector<double,_10>::~TPZManVector(&SidesCounter);
  TPZManVector<double,_3>::~TPZManVector(&XNode);
  TPZManVector<double,_3>::~TPZManVector(&Xside);
  TPZManVector<double,_3>::~TPZManVector(&SidePar);
  TPZManVector<double,_3>::~TPZManVector(&NeighPar);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Jacobian(TPZFMatrix<REAL> &coord, TPZVec<REAL>& par, TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv) const
{

    TPZGeoEl &gel = *fGeoEl;
    TPZManVector<REAL,3> NeighPar, SidePar, Xside(3,0.), XNode(3,0.);
    int majorSide = TGeo::NSides - 1;
	
    TPZManVector<REAL> SidesCounter(TGeo::NSides,0);
    TPZStack<int> LowNodeSides, LowAllSides;
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "input parameter par " << par;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    TPZFNMatrix<24> blend(TGeo::NNodes,1), Dblend(TGeo::Dimension,TGeo::NNodes);
    TGeo::Shape(par,blend,Dblend);
	
    TPZFNMatrix<9> J1, J2, Ax, JacTemp(3,TGeo::Dimension, 0.), Jneighbourhood;
    REAL Det;
    TPZGeoMesh *gmesh = gel.Mesh();
    for(int byside = majorSide; byside >= TGeo::NNodes; byside--)
    {
        TPZGeoElSide neighbyside = Neighbour(byside, gmesh);
        if(neighbyside.Exists())
        {
            TGeo::LowerDimensionSides(byside,LowNodeSides,0);
            TGeo::LowerDimensionSides(byside,LowAllSides);
            int dim = Neighbour(byside, gmesh).Dimension();
            TPZFNMatrix<9> Inv(dim,dim);
            int sidedim = neighbyside.Dimension();
            if(!MapToNeighSide(byside,sidedim,par,NeighPar, Jneighbourhood))
			{
				continue;
			}
            Neighbour(byside,gmesh).X(NeighPar,Xside);
            Neighbour(byside,gmesh).Jacobian(NeighPar,J1,Ax,Det,Inv);
            Ax.Transpose(); 
            Ax.Multiply(J1,J2);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "byside " << byside << std::endl;
        		sout << "side of the neighbour " << Neighbour(byside,gmesh).Side() << std::endl;
        		Neighbour(byside,gmesh).Element()->Print(sout);
				sout << "neighbour parameter(NeighPar) " << NeighPar << std::endl;
				sout << "Jacobian of the map(Jneighborhood) " << Jneighbourhood << std::endl;
				sout << "Xside " << Xside << std::endl;
				sout << "jacobian neighbour(J1) " << J1 << std::endl;
        		Ax.Print("Ax of the neighbour (Ax) ",sout);
				sout << "jacobian of the neighbour multiplied by the axes(J2) " << J2 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            J2.Multiply(Jneighbourhood,J1);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "acumulated jacobian(J1) " << J1 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            REAL blendTemp = 0.; 
            TPZManVector<REAL,3> DblendTemp(TGeo::Dimension,0.);
            for(int a = 0; a < LowNodeSides.NElements(); a++)
            {
                TPZManVector<REAL> parChanged(par.NElements());
                TGeo::Shape(parChanged,blend,Dblend);
				
                blendTemp += blend(LowNodeSides[a],0);
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    DblendTemp[b] += Dblend(b,LowNodeSides[a]);
                }
            }
			
            for(int a = 0; a < 3; a++)
            {
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    JacTemp(a,b) += (1 - SidesCounter[byside]) * (J1(a,b)*blendTemp + Xside[a]*DblendTemp[b]);
                }
            }
            for(int a = 0; a < LowAllSides.NElements(); a++) 
            {
                SidesCounter[LowAllSides[a]] += (1 - SidesCounter[byside]);
            }
        }
    }
	
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		JacTemp.Print("Jabobian before contributing the nodes",sout);
		sout << "SidesCounter " << SidesCounter << std::endl;
		sout << "DBlend " << Dblend << std::endl;
		sout << "NodeCoord " << coord << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    for(int a = 0; a < TGeo::NNodes; a++)
    {
        for(int b = 0; b < 3; b++) 
        { 
            for(int c = 0; c < TGeo::Dimension; c++)
            {
            	JacTemp(b,c) += (1 - SidesCounter[a]) * coord(b,a)*Dblend(c,a);
            }
        }
    }
	
    if(TGeo::Dimension == 1)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        detjac = jacobian(0,0);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) = 1./detjac;
    } else if(TGeo::Dimension == 2)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        detjac = jacobian(0,0)*jacobian(1,1) - jacobian(1,0)*jacobian(0,1);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) =  jacobian(1,1) / detjac;
        jacinv(1,1) =  jacobian(0,0) / detjac;
        jacinv(0,1) = -jacobian(0,1) / detjac;
        jacinv(1,0) = -jacobian(1,0) / detjac;
    }
    else
    {
        jacobian = JacTemp;
        axes.Resize(3,3); axes.Zero();
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        axes(0,0) = 1.; axes(1,1) = 1.; axes(2,2) = 1.;
        detjac = -jacobian(0,2)*jacobian(1,1)*jacobian(2,0);//- a02 a11 a20
        detjac += jacobian(0,1)*jacobian(1,2)*jacobian(2,0);//+ a01 a12 a20
        detjac += jacobian(0,2)*jacobian(1,0)*jacobian(2,1);//+ a02 a10 a21
        detjac -= jacobian(0,0)*jacobian(1,2)*jacobian(2,1);//- a00 a12 a21
        detjac -= jacobian(0,1)*jacobian(1,0)*jacobian(2,2);//- a01 a10 a22
        detjac += jacobian(0,0)*jacobian(1,1)*jacobian(2,2);//+ a00 a11 a22
        
        if(IsZero(detjac))
		{
#ifdef PZ_LOG
            if(logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Singular Jacobian " << detjac;
                LOGPZ_ERROR(logger, sout.str())
            }
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) = (-jacobian(1,2)*jacobian(2,1)+jacobian(1,1)*jacobian(2,2)) / detjac;//-a12 a21 + a11 a22
        jacinv(0,1) = ( jacobian(0,2)*jacobian(2,1)-jacobian(0,1)*jacobian(2,2)) / detjac;// a02 a21 - a01 a22
        jacinv(0,2) = (-jacobian(0,2)*jacobian(1,1)+jacobian(0,1)*jacobian(1,2)) / detjac;//-a02 a11 + a01 a12
        jacinv(1,0) = ( jacobian(1,2)*jacobian(2,0)-jacobian(1,0)*jacobian(2,2)) / detjac;// a12 a20 - a10 a22
        jacinv(1,1) = (-jacobian(0,2)*jacobian(2,0)+jacobian(0,0)*jacobian(2,2)) / detjac;//-a02 a20 + a00 a22
        jacinv(1,2) = ( jacobian(0,2)*jacobian(1,0)-jacobian(0,0)*jacobian(1,2)) / detjac;// a02 a10 - a00 a12
        jacinv(2,0) = (-jacobian(1,1)*jacobian(2,0)+jacobian(1,0)*jacobian(2,1)) / detjac;//-a11 a20 + a10 a21
        jacinv(2,1) = ( jacobian(0,1)*jacobian(2,0)-jacobian(0,0)*jacobian(2,1)) / detjac;// a01 a20 - a00 a21
        jacinv(2,2) = (-jacobian(0,1)*jacobian(1,0)+jacobian(0,0)*jacobian(1,1)) / detjac;//-a01 a10 + a00 a11
    }
}